

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarExecFuse.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  LogFatal *pLVar4;
  char **ppcVar5;
  bool bVar6;
  __uid_t _Var7;
  __mode_t __mask;
  int iVar8;
  int iVar9;
  __pid_t __pid;
  char *pcVar10;
  ulong uVar11;
  pointer ppVar12;
  int *piVar13;
  unsigned_long *puVar14;
  undefined8 uVar15;
  ostream *poVar16;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  undefined1 *puVar17;
  optional<unsigned_long> oVar18;
  char *pcStack_2bc0;
  char *pcStack_2bb8;
  ostream *local_2bb0;
  ostream *local_2ba8;
  ostream *local_2ba0;
  ostream *local_2b98;
  ostream *local_2b90;
  ostream *local_2b88;
  ostream *local_2b80;
  ostream *local_2b78;
  ostream *local_2b70;
  LogFatal *local_2b68;
  ostream *local_2b60;
  ostream *local_2b58;
  ostream *local_2b50;
  ostream *local_2b48;
  ostream *local_2b40;
  ostream *local_2b38;
  ostream *local_2b30;
  ostream *local_2b28;
  LogFatal *local_2b20;
  char **local_2b18;
  ostream *local_2b10;
  ostream *local_2b08;
  ostream *local_2b00;
  ostream *local_2af8;
  ostream *local_2af0;
  ostream *local_2ae8;
  ostream *local_2ae0;
  ostream *local_2ad8;
  ostream *local_2ad0;
  LogFatal *local_2ac8;
  int local_2abc;
  ostream *local_2ab8;
  ostream *local_2ab0;
  ostream *local_2aa8;
  ostream *local_2aa0;
  ostream *local_2a98;
  ostream *local_2a90;
  ostream *local_2a88;
  ostream *local_2a80;
  ostream *local_2a78;
  LogFatal *local_2a70;
  ostream *local_2a68;
  ostream *local_2a60;
  ostream *local_2a58;
  ostream *local_2a50;
  ostream *local_2a48;
  ostream *local_2a40;
  LogFatal *local_2a38;
  undefined1 local_2a29;
  rep local_2a28;
  undefined1 local_2a19;
  ostream *local_2a18;
  ostream *local_2a10;
  ostream *local_2a08;
  ostream *local_2a00;
  ostream *local_29f8;
  ostream *local_29f0;
  ostream *local_29e8;
  LogFatal *local_29e0;
  ostream *local_29d8;
  ostream *local_29d0;
  ostream *local_29c8;
  ostream *local_29c0;
  ostream *local_29b8;
  ostream *local_29b0;
  ostream *local_29a8;
  LogFatal *local_29a0;
  ostream *local_2998;
  ostream *local_2990;
  ostream *local_2988;
  ostream *local_2980;
  ostream *local_2978;
  ostream *local_2970;
  ostream *local_2968;
  LogFatal *local_2960;
  ostream *local_2958;
  ostream *local_2950;
  ostream *local_2948;
  ostream *local_2940;
  ostream *local_2938;
  ostream *local_2930;
  ostream *local_2928;
  ostream *local_2920;
  LogFatal *local_2918;
  __pid_t local_290c;
  ostream *local_2908;
  ostream *local_2900;
  ostream *local_28f8;
  ostream *local_28f0;
  ostream *local_28e8;
  ostream *local_28e0;
  ostream *local_28d8;
  ostream *local_28d0;
  LogFatal *local_28c8;
  char *local_28c0;
  char *local_28b8;
  undefined8 local_28b0;
  __node_base_ptr local_28a8;
  byte local_2899;
  allocator<char> *local_2898;
  ostream *local_2890;
  ostream *local_2888;
  ostream *local_2880;
  ostream *local_2878;
  ostream *local_2870;
  ostream *local_2868;
  ostream *local_2860;
  ostream *local_2858;
  LogFatal *local_2850;
  undefined1 local_2845;
  int local_2844;
  ostream *local_2840;
  ostream *local_2838;
  ostream *local_2830;
  ostream *local_2828;
  ostream *local_2820;
  ostream *local_2818;
  ostream *local_2810;
  LogFatal *local_2808;
  int local_27fc;
  ostream *local_27f8;
  size_t local_27f0;
  undefined1 local_27e1;
  _Storage<unsigned_long,_true> local_27e0;
  ostream *local_27d8;
  ostream *local_27d0;
  ostream *local_27c8;
  ostream *local_27c0;
  ostream *local_27b8;
  ostream *local_27b0;
  ostream *local_27a8;
  ostream *local_27a0;
  LogFatal *local_2798;
  ostream *local_2790;
  ostream *local_2788;
  ostream *local_2780;
  ostream *local_2778;
  ostream *local_2770;
  ostream *local_2768;
  ostream *local_2760;
  ostream *local_2758;
  ostream *local_2750;
  LogFatal *local_2748;
  ostream *local_2740;
  ostream *local_2738;
  ostream *local_2730;
  ostream *local_2728;
  ostream *local_2720;
  ostream *local_2718;
  __syscall_slong_t *local_2710;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_2708;
  allocator<char> *local_2700;
  ostream *local_26f8;
  ostream *local_26f0;
  ostream *local_26e8;
  ostream *local_26e0;
  ostream *local_26d8;
  ostream *local_26d0;
  LogFatal *local_26c8;
  ostream *local_26c0;
  ostream *local_26b8;
  ostream *local_26b0;
  ostream *local_26a8;
  ostream *local_26a0;
  ostream *local_2698;
  LogFatal *local_2690;
  string *local_2688;
  undefined1 local_2679;
  ostream *local_2678;
  ostream *local_2670;
  ostream *local_2668;
  ostream *local_2660;
  ostream *local_2658;
  ostream *local_2650;
  ostream *local_2648;
  LogFatal *local_2640;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_2638;
  allocator<char> *local_2630;
  mapped_type *local_2628;
  allocator<char> *local_2620;
  invalid_argument *local_25b8;
  size_t local_25b0;
  mapped_type *local_25a8;
  size_t local_25a0;
  allocator<char> *local_2598;
  unsigned_long_long local_2590;
  mapped_type *local_2588;
  allocator<char> *local_2580;
  bool local_2571;
  ostream *local_2570;
  ostream *local_2568;
  ostream *local_2560;
  ostream *local_2558;
  ostream *local_2550;
  ostream *local_2548;
  LogFatal *local_2540;
  __uid_t local_2534;
  LogFatal local_2530;
  int local_23a8;
  int local_23a4;
  int i_1;
  int i;
  ulong local_2218;
  unsigned_long __vla_expr0;
  LogFatal local_2208;
  LogFatal local_2080;
  int local_1ef4;
  duration<long,_std::ratio<1L,_1000000L>_> local_1ef0;
  LogFatal local_1ee8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1d60;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1d58;
  duration<long,_std::ratio<1L,_1L>_> local_1d50;
  seconds timeout;
  time_point start;
  LogFatal local_1bb8;
  LogFatal local_1a30;
  LogFatal local_18a8;
  uint local_171c;
  undefined1 local_1718 [4];
  int status;
  int local_1590;
  allocator<char> local_1589;
  int ret;
  string local_1568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1548;
  string local_1528;
  undefined1 local_1508 [8];
  string opts;
  pid_t pid;
  undefined1 local_1350 [3];
  bool newMount;
  int bootstrap_fd;
  undefined1 local_1330 [8];
  string exec_path;
  undefined1 local_1180 [4];
  int lock_fd;
  undefined1 local_1160 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> lockfile;
  undefined1 local_1120 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> mount_path;
  size_t squashfuse_idle_timeout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10d8;
  string local_10b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1098;
  _Storage<unsigned_long,_true> local_1078;
  optional<unsigned_long> maybe_cgroup_inode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1048;
  undefined1 local_1028 [8];
  string mount_directory;
  char *env_seed;
  string user_basedir;
  LogFatal local_e58;
  undefined1 local_cd0 [8];
  stat st;
  undefined1 local_ab8 [8];
  stat st_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *candidate;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a18;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  allocator<char> local_9d9;
  key_type local_9d8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_9b8;
  undefined1 local_9b0 [8];
  string mountroot;
  LogFatal local_808;
  char *local_680;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_678;
  LogFatal local_670;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_4e8;
  allocator<char> local_4d9;
  key_type local_4d8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_4b8;
  iterator it;
  string execpath;
  key_type local_488;
  string local_468 [8];
  string uuid;
  exception *ex;
  key_type local_288;
  allocator<char> local_261;
  key_type local_260;
  size_t local_240;
  size_t end;
  size_t offset;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  header;
  char *xar_path;
  bool print_only;
  bool mount_only;
  __mode_t old_umask;
  LogFatal local_1d8;
  string local_50;
  double local_30;
  double launch_time;
  timeval tv;
  char **argv_local;
  int argc_local;
  
  puVar17 = (undefined1 *)&pcStack_2bb8;
  pcStack_2bc0 = (char *)0x104a46;
  tv.tv_usec = (__suseconds_t)argv;
  gettimeofday((timeval *)&launch_time,(__timezone_ptr_t)0x0);
  local_30 = (double)tv.tv_sec / 1000000.0 + (double)(long)launch_time;
  pcStack_2bc0 = (char *)0x104a75;
  std::__cxx11::to_string(&local_50,local_30);
  pcStack_2bc0 = (char *)0x104a7e;
  pcVar10 = (char *)std::__cxx11::string::c_str();
  pcStack_2bc0 = (char *)0x104a92;
  setenv("XAREXEC_LAUNCH_TIMESTAMP",pcVar10,1);
  pcStack_2bc0 = (char *)0x104a9b;
  std::__cxx11::string::~string((string *)&local_50);
  pcStack_2bc0 = (char *)0x104aa0;
  local_2534 = getuid();
  pcStack_2bc0 = (char *)0x104aab;
  _Var7 = geteuid();
  if (local_2534 != _Var7) {
    local_2540 = &local_1d8;
    pcStack_2bc0 = (char *)0x104ad5;
    memset(local_2540,0,0x188);
    pcStack_2bc0 = (char *)0x104ae1;
    tools::xar::detail::LogFatal::LogFatal(local_2540);
    pcStack_2bc0 = (char *)0x104aef;
    local_2548 = tools::xar::detail::LogFatal::stream(&local_1d8);
    pcStack_2bc0 = (char *)0x104b0b;
    local_2550 = std::operator<<(local_2548,"FATAL ");
    pcStack_2bc0 = (char *)0x104b27;
    local_2558 = std::operator<<(local_2550,
                                 "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                );
    pcStack_2bc0 = (char *)0x104b43;
    local_2560 = std::operator<<(local_2558,":");
    pcStack_2bc0 = (char *)0x104b5d;
    local_2568 = (ostream *)std::ostream::operator<<(local_2560,0xe7);
    pcStack_2bc0 = (char *)0x104b79;
    local_2570 = std::operator<<(local_2568,": ");
    pcStack_2bc0 = (char *)0x104b95;
    std::operator<<(local_2570,"getuid() == geteuid()");
    pcStack_2bc0 = &LAB_00104ba3;
    tools::xar::detail::LogFatal::~LogFatal(&local_1d8);
  }
  pcStack_2bc0 = (char *)0x104bf7;
  __mask = umask(0x12);
  if (argc < 2) {
    pcStack_2bc0 = (char *)0x104c08;
    anon_unknown.dwarf_5c0f::usage();
    return 1;
  }
  argv_local._0_4_ = argc + -1;
  bVar2 = false;
  bVar3 = false;
  pcVar10 = extraout_RDX;
  lVar1 = tv.tv_usec;
  while( true ) {
    tv.tv_usec = lVar1 + 8;
    local_2571 = false;
    if (*(long *)tv.tv_usec != 0) {
      local_2571 = **(char **)tv.tv_usec == '-';
    }
    if (local_2571 == false) break;
    pcStack_2bc0 = (char *)0x104c81;
    iVar8 = strcmp(*(char **)tv.tv_usec,"-m");
    if (iVar8 == 0) {
      bVar2 = true;
      pcVar10 = extraout_RDX_00;
    }
    else {
      pcStack_2bc0 = (char *)0x104ca2;
      iVar8 = strcmp(*(char **)tv.tv_usec,"-n");
      if (iVar8 != 0) {
        pcStack_2bc0 = (char *)0x104cc3;
        iVar8 = strcmp(*(char **)tv.tv_usec,"-h");
        if (iVar8 == 0) {
          pcStack_2bc0 = (char *)0x104ccd;
          anon_unknown.dwarf_5c0f::usage();
          return 0;
        }
        pcStack_2bc0 = (char *)0x104cde;
        anon_unknown.dwarf_5c0f::usage();
        return 1;
      }
      bVar3 = true;
      pcVar10 = extraout_RDX_01;
    }
    argv_local._0_4_ = (int)argv_local + -1;
    lVar1 = tv.tv_usec;
  }
  if (*(long *)tv.tv_usec == 0) {
    pcStack_2bc0 = (char *)0x104d15;
    anon_unknown.dwarf_5c0f::usage();
    return 1;
  }
  header._M_h._M_single_bucket = *(__node_base_ptr *)tv.tv_usec;
  tv.tv_usec = lVar1 + 0x10;
  pcStack_2bc0 = (char *)0x104d56;
  tools::xar::read_xar_header_abi_cxx11_
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&offset,(xar *)header._M_h._M_single_bucket,pcVar10);
  local_2580 = &local_261;
  pcStack_2bc0 = (char *)0x104d69;
  std::allocator<char>::allocator();
  pcStack_2bc0 = (char *)0x104d83;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"OFFSET",local_2580);
  pcStack_2bc0 = (char *)0x104d98;
  local_2588 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&offset,&local_260);
  pcStack_2bc0 = (char *)0x104db9;
  local_2590 = std::__cxx11::stoull(local_2588,&local_240,10);
  pcStack_2bc0 = (char *)0x104ddc;
  end = local_2590;
  std::__cxx11::string::~string((string *)&local_260);
  pcStack_2bc0 = (char *)0x104de8;
  std::allocator<char>::~allocator(&local_261);
  local_25a0 = local_240;
  local_2598 = (allocator<char> *)((long)&ex + 7);
  pcStack_2bc0 = (char *)0x104e09;
  std::allocator<char>::allocator();
  pcStack_2bc0 = (char *)0x104e23;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"OFFSET",local_2598);
  pcStack_2bc0 = (char *)0x104e38;
  local_25a8 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&offset,&local_288);
  pcStack_2bc0 = (char *)0x104e4d;
  local_25b0 = std::__cxx11::string::size();
  pcStack_2bc0 = (char *)0x104e60;
  std::__cxx11::string::~string((string *)&local_288);
  pcStack_2bc0 = (char *)0x104e6c;
  std::allocator<char>::~allocator((allocator<char> *)((long)&ex + 7));
  if (local_25a0 != local_25b0) {
    pcStack_2bc0 = (char *)0x104e8d;
    local_25b8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    pcStack_2bc0 = (char *)0x104ea6;
    std::invalid_argument::invalid_argument(local_25b8,"Offset not entirely an integer");
    pcStack_2bc0 = &LAB_00104ec2;
    __cxa_throw(local_25b8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
               );
  }
  local_2620 = (allocator<char> *)(execpath.field_2._M_local_buf + 0xf);
  pcStack_2bc0 = (char *)0x1051f2;
  std::allocator<char>::allocator();
  pcStack_2bc0 = (char *)0x10520c;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"UUID",local_2620);
  pcStack_2bc0 = (char *)0x105221;
  local_2628 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&offset,&local_488);
  pcStack_2bc0 = (char *)0x10523d;
  std::__cxx11::string::string(local_468,(string *)local_2628);
  pcStack_2bc0 = (char *)0x10524b;
  std::__cxx11::string::~string((string *)&local_488);
  pcStack_2bc0 = (char *)0x105257;
  std::allocator<char>::~allocator((allocator<char> *)(execpath.field_2._M_local_buf + 0xf));
  pcStack_2bc0 = (char *)0x105263;
  std::__cxx11::string::string((string *)&it);
  local_2630 = &local_4d9;
  pcStack_2bc0 = (char *)0x105276;
  std::allocator<char>::allocator();
  pcStack_2bc0 = (char *)0x105290;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,"XAREXEC_TARGET",local_2630);
  pcStack_2bc0 = (char *)0x1052a5;
  local_2638._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&offset,&local_4d8);
  pcStack_2bc0 = (char *)0x1052c8;
  local_4b8._M_cur = local_2638._M_cur;
  std::__cxx11::string::~string((string *)&local_4d8);
  pcStack_2bc0 = (char *)0x1052d4;
  std::allocator<char>::~allocator(&local_4d9);
  pcStack_2bc0 = (char *)0x1052e0;
  local_4e8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&offset);
  pcStack_2bc0 = (char *)0x1052fa;
  bVar6 = std::__detail::operator!=(&local_4b8,&local_4e8);
  if (bVar6) {
    pcStack_2bc0 = (char *)0x10530f;
    ppVar12 = std::__detail::
              _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
              ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                            *)&local_4b8);
    pcStack_2bc0 = (char *)0x105322;
    std::__cxx11::string::operator=((string *)&it,(string *)&ppVar12->second);
  }
  if (!bVar2) {
    pcStack_2bc0 = (char *)0x1053df;
    uVar11 = std::__cxx11::string::empty();
    if ((uVar11 & 1) != 0) {
      local_2640 = &local_670;
      pcStack_2bc0 = (char *)0x105402;
      memset(local_2640,0,0x188);
      pcStack_2bc0 = (char *)0x10540e;
      tools::xar::detail::LogFatal::LogFatal(local_2640);
      pcStack_2bc0 = (char *)0x10541c;
      local_2648 = tools::xar::detail::LogFatal::stream(&local_670);
      pcStack_2bc0 = (char *)0x105438;
      local_2650 = std::operator<<(local_2648,"FATAL ");
      pcStack_2bc0 = (char *)0x105454;
      local_2658 = std::operator<<(local_2650,
                                   "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                  );
      pcStack_2bc0 = (char *)0x105470;
      local_2660 = std::operator<<(local_2658,":");
      pcStack_2bc0 = (char *)0x10548a;
      local_2668 = (ostream *)std::ostream::operator<<(local_2660,0x126);
      pcStack_2bc0 = (char *)0x1054a6;
      local_2670 = std::operator<<(local_2668,": ");
      pcStack_2bc0 = (char *)0x1054c2;
      local_2678 = std::operator<<(local_2670,"No XAREXEC_TARGET in XAR header of ");
      pcStack_2bc0 = (char *)0x1054de;
      std::operator<<(local_2678,(char *)header._M_h._M_single_bucket);
      pcStack_2bc0 = &LAB_001054ec;
      tools::xar::detail::LogFatal::~LogFatal(&local_670);
    }
  }
  local_2688 = local_468;
  pcStack_2bc0 = (char *)0x10551d;
  local_678._M_current = (char *)std::__cxx11::string::begin();
  pcStack_2bc0 = (char *)0x105530;
  local_680 = (char *)std::__cxx11::string::end();
  pcStack_2bc0 = (char *)0x105551;
  local_2679 = std::
               all_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                         (local_678,
                          (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )local_680,isxdigit);
  if (!(bool)local_2679) {
    local_2690 = &local_808;
    pcStack_2bc0 = (char *)0x105583;
    memset(local_2690,0,0x188);
    pcStack_2bc0 = (char *)0x10558f;
    tools::xar::detail::LogFatal::LogFatal(local_2690);
    pcStack_2bc0 = (char *)0x10559d;
    local_2698 = tools::xar::detail::LogFatal::stream(&local_808);
    pcStack_2bc0 = (char *)0x1055b9;
    local_26a0 = std::operator<<(local_2698,"FATAL ");
    pcStack_2bc0 = (char *)0x1055d5;
    local_26a8 = std::operator<<(local_26a0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                );
    pcStack_2bc0 = (char *)0x1055f1;
    local_26b0 = std::operator<<(local_26a8,":");
    pcStack_2bc0 = (char *)0x10560b;
    local_26b8 = (ostream *)std::ostream::operator<<(local_26b0,0x129);
    pcStack_2bc0 = (char *)0x105627;
    local_26c0 = std::operator<<(local_26b8,": ");
    pcStack_2bc0 = (char *)0x105643;
    std::operator<<(local_26c0,"uuid must only contain hex digits");
    pcStack_2bc0 = &LAB_00105651;
    tools::xar::detail::LogFatal::~LogFatal(&local_808);
  }
  pcStack_2bc0 = (char *)0x10567b;
  uVar11 = std::__cxx11::string::empty();
  if ((uVar11 & 1) != 0) {
    local_26c8 = (LogFatal *)((long)&mountroot.field_2 + 8);
    pcStack_2bc0 = (char *)0x10569e;
    memset(local_26c8,0,0x188);
    pcStack_2bc0 = (char *)0x1056aa;
    tools::xar::detail::LogFatal::LogFatal(local_26c8);
    pcStack_2bc0 = (char *)0x1056b8;
    local_26d0 = tools::xar::detail::LogFatal::stream((LogFatal *)((long)&mountroot.field_2 + 8));
    pcStack_2bc0 = (char *)0x1056d4;
    local_26d8 = std::operator<<(local_26d0,"FATAL ");
    pcStack_2bc0 = (char *)0x1056f0;
    local_26e0 = std::operator<<(local_26d8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                );
    pcStack_2bc0 = (char *)0x10570c;
    local_26e8 = std::operator<<(local_26e0,":");
    pcStack_2bc0 = (char *)0x105726;
    local_26f0 = (ostream *)std::ostream::operator<<(local_26e8,300);
    pcStack_2bc0 = (char *)0x105742;
    local_26f8 = std::operator<<(local_26f0,": ");
    pcStack_2bc0 = (char *)0x10575e;
    std::operator<<(local_26f8,"uuid must be non-empty");
    pcStack_2bc0 = &LAB_0010576c;
    tools::xar::detail::LogFatal::~LogFatal((LogFatal *)((long)&mountroot.field_2 + 8));
  }
  pcStack_2bc0 = (char *)0x105796;
  std::__cxx11::string::string((string *)local_9b0);
  local_2700 = &local_9d9;
  pcStack_2bc0 = (char *)0x1057a9;
  std::allocator<char>::allocator();
  pcStack_2bc0 = (char *)0x1057c3;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d8,"MOUNT_ROOT",local_2700);
  pcStack_2bc0 = (char *)0x1057d8;
  local_2708._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&offset,&local_9d8);
  pcStack_2bc0 = (char *)0x105809;
  local_9b8._M_cur = local_2708._M_cur;
  local_4b8._M_cur = local_2708._M_cur;
  std::__cxx11::string::~string((string *)&local_9d8);
  pcStack_2bc0 = (char *)0x105815;
  std::allocator<char>::~allocator(&local_9d9);
  pcStack_2bc0 = (char *)0x105821;
  __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&offset);
  pcStack_2bc0 = (char *)0x10583b;
  bVar6 = std::__detail::operator!=
                    (&local_4b8,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      *)&__range2);
  if (bVar6) {
    pcStack_2bc0 = (char *)0x105850;
    ppVar12 = std::__detail::
              _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
              ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                            *)&local_4b8);
    pcStack_2bc0 = (char *)0x105863;
    std::__cxx11::string::operator=((string *)local_9b0,(string *)&ppVar12->second);
  }
  else {
    pcStack_2bc0 = (char *)0x1058d0;
    tools::xar::default_mount_roots_abi_cxx11_();
    pcStack_2bc0 = (char *)0x1058ec;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__begin2);
    pcStack_2bc0 = (char *)0x1058ff;
    local_a18._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__begin2);
    while( true ) {
      pcStack_2bc0 = (char *)0x105919;
      bVar6 = __gnu_cxx::operator!=(&__end2,&local_a18);
      if (!bVar6) break;
      pcStack_2bc0 = (char *)0x105938;
      st_1.__glibc_reserved[2] =
           (__syscall_slong_t)
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      pcStack_2bc0 = (char *)0x10594b;
      pcVar10 = (char *)std::__cxx11::string::c_str();
      pcStack_2bc0 = (char *)0x10595a;
      iVar8 = stat(pcVar10,(stat *)local_ab8);
      if ((iVar8 == 0) && (((uint)st_1.st_nlink & 0xfff) == 0x3ff)) {
        pcStack_2bc0 = (char *)0x105984;
        std::__cxx11::string::operator=((string *)local_9b0,(string *)st_1.__glibc_reserved[2]);
        break;
      }
      pcStack_2bc0 = (char *)0x1059c3;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    pcStack_2bc0 = (char *)0x1059d4;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__begin2);
    pcStack_2bc0 = (char *)0x1059e0;
    uVar11 = std::__cxx11::string::empty();
    if ((uVar11 & 1) != 0) {
      local_2710 = st.__glibc_reserved + 2;
      pcStack_2bc0 = (char *)0x105a03;
      memset(local_2710,0,0x188);
      pcStack_2bc0 = (char *)0x105a0f;
      tools::xar::detail::LogFatal::LogFatal((LogFatal *)local_2710);
      pcStack_2bc0 = (char *)0x105a1d;
      local_2718 = tools::xar::detail::LogFatal::stream((LogFatal *)(st.__glibc_reserved + 2));
      pcStack_2bc0 = (char *)0x105a39;
      local_2720 = std::operator<<(local_2718,"FATAL ");
      pcStack_2bc0 = (char *)0x105a55;
      local_2728 = std::operator<<(local_2720,
                                   "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                  );
      pcStack_2bc0 = (char *)0x105a71;
      local_2730 = std::operator<<(local_2728,":");
      pcStack_2bc0 = (char *)0x105a8b;
      local_2738 = (ostream *)std::ostream::operator<<(local_2730,0x13f);
      pcStack_2bc0 = (char *)0x105aa7;
      local_2740 = std::operator<<(local_2738,": ");
      pcStack_2bc0 = (char *)0x105abc;
      tools::xar::no_mount_roots_help_message(local_2740);
      pcStack_2bc0 = &LAB_00105aca;
      tools::xar::detail::LogFatal::~LogFatal((LogFatal *)(st.__glibc_reserved + 2));
    }
  }
  pcStack_2bc0 = (char *)0x105af6;
  pcVar10 = (char *)std::__cxx11::string::c_str();
  pcStack_2bc0 = (char *)0x105b05;
  iVar8 = stat(pcVar10,(stat *)local_cd0);
  if (iVar8 != 0) {
    local_2748 = &local_e58;
    pcStack_2bc0 = (char *)0x105b28;
    memset(local_2748,0,0x188);
    pcStack_2bc0 = (char *)0x105b34;
    tools::xar::detail::LogFatal::LogFatal(local_2748);
    pcStack_2bc0 = (char *)0x105b42;
    local_2750 = tools::xar::detail::LogFatal::stream(&local_e58);
    pcStack_2bc0 = (char *)0x105b5e;
    local_2758 = std::operator<<(local_2750,"FATAL ");
    pcStack_2bc0 = (char *)0x105b7a;
    local_2760 = std::operator<<(local_2758,
                                 "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                );
    pcStack_2bc0 = (char *)0x105b96;
    local_2768 = std::operator<<(local_2760,":");
    pcStack_2bc0 = (char *)0x105bb0;
    local_2770 = (ostream *)std::ostream::operator<<(local_2768,0x145);
    pcStack_2bc0 = (char *)0x105bcc;
    local_2778 = std::operator<<(local_2770,": ");
    pcStack_2bc0 = (char *)0x105be8;
    local_2780 = std::operator<<(local_2778,"Failed to stat mount root \'");
    pcStack_2bc0 = (char *)0x105c04;
    local_2788 = std::operator<<(local_2780,(string *)local_9b0);
    pcStack_2bc0 = (char *)0x105c20;
    local_2790 = std::operator<<(local_2788,"\': ");
    pcStack_2bc0 = (char *)0x105c2e;
    piVar13 = __errno_location();
    pcStack_2bc0 = (char *)0x105c35;
    pcVar10 = strerror(*piVar13);
    pcStack_2bc0 = (char *)0x105c44;
    std::operator<<(local_2790,pcVar10);
    pcStack_2bc0 = &LAB_00105c52;
    tools::xar::detail::LogFatal::~LogFatal(&local_e58);
  }
  if (((uint)st.st_nlink & 0xfff) != 0x3ff) {
    local_2798 = (LogFatal *)((long)&user_basedir.field_2 + 8);
    pcStack_2bc0 = (char *)0x105ca0;
    memset(local_2798,0,0x188);
    pcStack_2bc0 = (char *)0x105cac;
    tools::xar::detail::LogFatal::LogFatal(local_2798);
    pcStack_2bc0 = (char *)0x105cba;
    local_27a0 = tools::xar::detail::LogFatal::stream((LogFatal *)((long)&user_basedir.field_2 + 8))
    ;
    pcStack_2bc0 = (char *)0x105cd6;
    local_27a8 = std::operator<<(local_27a0,"FATAL ");
    pcStack_2bc0 = (char *)0x105cf2;
    local_27b0 = std::operator<<(local_27a8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                );
    pcStack_2bc0 = (char *)0x105d0e;
    local_27b8 = std::operator<<(local_27b0,":");
    pcStack_2bc0 = (char *)0x105d28;
    local_27c0 = (ostream *)std::ostream::operator<<(local_27b8,0x149);
    pcStack_2bc0 = (char *)0x105d44;
    local_27c8 = std::operator<<(local_27c0,": ");
    pcStack_2bc0 = (char *)0x105d60;
    local_27d0 = std::operator<<(local_27c8,"Mount root \'");
    pcStack_2bc0 = (char *)0x105d7c;
    local_27d8 = std::operator<<(local_27d0,(string *)local_9b0);
    pcStack_2bc0 = (char *)0x105d98;
    std::operator<<(local_27d8,"\' permissions should be 01777");
    pcStack_2bc0 = &LAB_00105da6;
    tools::xar::detail::LogFatal::~LogFatal((LogFatal *)((long)&user_basedir.field_2 + 8));
  }
  pcStack_2bc0 = (char *)0x105dd7;
  anon_unknown.dwarf_5c0f::get_user_basedir((string *)&env_seed,(string *)local_9b0);
  pcStack_2bc0 = (char *)0x105de5;
  mount_directory.field_2._8_8_ = getenv("XAR_MOUNT_SEED");
  pcStack_2bc0 = (char *)0x105dff;
  std::__cxx11::string::string((string *)local_1028,local_468);
  if ((mount_directory.field_2._8_8_ != 0) && (*(char *)mount_directory.field_2._8_8_ != '\0')) {
    pcStack_2bc0 = (char *)0x105e2c;
    pcVar10 = strchr((char *)mount_directory.field_2._8_8_,0x2f);
    if (pcVar10 == (char *)0x0) {
      pcStack_2bc0 = (char *)0x105e45;
      std::__cxx11::string::operator+=((string *)local_1028,"-seed-");
      pcStack_2bc0 = (char *)0x105e5a;
      std::__cxx11::string::operator+=((string *)local_1028,(char *)mount_directory.field_2._8_8_);
      goto LAB_00106048;
    }
  }
  pcStack_2bc0 = (char *)0x105ea2;
  iVar8 = stat("/proc/self/ns/pid",(stat *)local_cd0);
  if (iVar8 == 0) {
    pcStack_2bc0 = (char *)0x105ebe;
    std::__cxx11::to_string
              ((string *)
               &maybe_cgroup_inode.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged,st.st_dev);
    pcStack_2bc0 = (char *)0x105eda;
    std::operator+(&local_1048,"-seed-nspid",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &maybe_cgroup_inode.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_long>._M_engaged);
    pcStack_2bc0 = (char *)0x105eef;
    std::__cxx11::string::operator+=((string *)local_1028,(string *)&local_1048);
    pcStack_2bc0 = (char *)0x105efd;
    std::__cxx11::string::~string((string *)&local_1048);
    pcStack_2bc0 = (char *)0x105f09;
    std::__cxx11::string::~string
              ((string *)
               &maybe_cgroup_inode.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged);
    pcStack_2bc0 = (char *)0x105f15;
    oVar18 = tools::xar::read_sysfs_cgroup_inode("/proc/self/cgroup");
    local_27e0._M_value =
         oVar18.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_27e1 = oVar18.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._M_engaged;
    pcStack_2bc0 = (char *)0x105f4a;
    local_1078._M_value = local_27e0._M_value;
    maybe_cgroup_inode.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ = local_27e1;
    bVar6 = std::optional::operator_cast_to_bool((optional *)&local_1078);
    if (bVar6) {
      pcStack_2bc0 = (char *)0x105f5f;
      puVar14 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_1078);
      pcStack_2bc0 = (char *)0x105f6e;
      std::__cxx11::to_string(&local_10b8,*puVar14);
      pcStack_2bc0 = (char *)0x105f8a;
      std::operator+(&local_1098,"_cgpid",&local_10b8);
      pcStack_2bc0 = (char *)0x105f9f;
      std::__cxx11::string::operator+=((string *)local_1028,(string *)&local_1098);
      pcStack_2bc0 = (char *)0x105fad;
      std::__cxx11::string::~string((string *)&local_1098);
      pcStack_2bc0 = (char *)0x105fb9;
      std::__cxx11::string::~string((string *)&local_10b8);
    }
  }
LAB_00106048:
  pcStack_2bc0 = (char *)0x10605b;
  iVar8 = stat("/proc/self/ns/mnt",(stat *)local_cd0);
  if (iVar8 == 0) {
    pcStack_2bc0 = (char *)0x106077;
    std::__cxx11::to_string((string *)&squashfuse_idle_timeout,st.st_dev);
    pcStack_2bc0 = (char *)0x106093;
    std::operator+(&local_10d8,"-ns-",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &squashfuse_idle_timeout);
    pcStack_2bc0 = (char *)0x1060a8;
    std::__cxx11::string::operator+=((string *)local_1028,(string *)&local_10d8);
    pcStack_2bc0 = (char *)0x1060b6;
    std::__cxx11::string::~string((string *)&local_10d8);
    pcStack_2bc0 = (char *)0x1060c2;
    std::__cxx11::string::~string((string *)&squashfuse_idle_timeout);
  }
  pcStack_2bc0 = (char *)0x10610c;
  local_27f0 = anon_unknown.dwarf_5c0f::get_squashfuse_timeout();
  pcStack_2bc0 = (char *)0x10613d;
  mount_path.field_2._8_8_ = local_27f0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&lockfile.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&env_seed,"/")
  ;
  pcStack_2bc0 = (char *)0x106159;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&lockfile.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1028);
  pcStack_2bc0 = (char *)0x106167;
  std::__cxx11::string::~string((string *)(lockfile.field_2._M_local_buf + 8));
  if (bVar3) {
    pcStack_2bc0 = (char *)0x106187;
    local_27f8 = std::operator<<((ostream *)&std::cout,(string *)local_1120);
    pcStack_2bc0 = (char *)0x1061a3;
    std::ostream::operator<<(local_27f8,std::endl<char,std::char_traits<char>>);
  }
  else {
    pcStack_2bc0 = (char *)0x10620f;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&env_seed,
                   "/lockfile.");
    pcStack_2bc0 = (char *)0x10622b;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1028);
    pcStack_2bc0 = (char *)0x106239;
    std::__cxx11::string::~string((string *)local_1180);
    pcStack_2bc0 = (char *)0x106245;
    iVar8 = anon_unknown.dwarf_5c0f::grab_lock((string *)local_1160);
    pcStack_2bc0 = (char *)0x106265;
    local_27fc = iVar8;
    pcVar10 = (char *)std::__cxx11::string::c_str();
    pcStack_2bc0 = (char *)0x106272;
    iVar9 = mkdir(pcVar10,0x1ed);
    if (iVar9 != 0) {
      pcStack_2bc0 = (char *)0x1062bb;
      piVar13 = __errno_location();
      if (*piVar13 != 0x11) {
        local_2808 = (LogFatal *)((long)&exec_path.field_2 + 8);
        pcStack_2bc0 = (char *)0x1062de;
        memset(local_2808,0,0x188);
        pcStack_2bc0 = (char *)0x1062ea;
        tools::xar::detail::LogFatal::LogFatal(local_2808);
        pcStack_2bc0 = (char *)0x1062f8;
        local_2810 = tools::xar::detail::LogFatal::stream
                               ((LogFatal *)((long)&exec_path.field_2 + 8));
        pcStack_2bc0 = (char *)0x106314;
        local_2818 = std::operator<<(local_2810,"FATAL ");
        pcStack_2bc0 = (char *)0x106330;
        local_2820 = std::operator<<(local_2818,
                                     "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                    );
        pcStack_2bc0 = (char *)0x10634c;
        local_2828 = std::operator<<(local_2820,":");
        pcStack_2bc0 = (char *)0x106366;
        local_2830 = (ostream *)std::ostream::operator<<(local_2828,399);
        pcStack_2bc0 = (char *)0x106382;
        local_2838 = std::operator<<(local_2830,": ");
        pcStack_2bc0 = (char *)0x10639e;
        local_2840 = std::operator<<(local_2838,"mkdir failed:");
        pcStack_2bc0 = (char *)0x1063ac;
        piVar13 = __errno_location();
        pcStack_2bc0 = (char *)0x1063b3;
        pcVar10 = strerror(*piVar13);
        pcStack_2bc0 = (char *)0x1063c2;
        std::operator<<(local_2840,pcVar10);
        pcStack_2bc0 = &LAB_001063d0;
        tools::xar::detail::LogFatal::~LogFatal((LogFatal *)((long)&exec_path.field_2 + 8));
      }
    }
    pcStack_2bc0 = (char *)0x10640a;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1350,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1120,
                   "/");
    pcStack_2bc0 = (char *)0x106426;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1330,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1350,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
    pcStack_2bc0 = (char *)0x106434;
    std::__cxx11::string::~string((string *)local_1350);
    pcStack_2bc0 = (char *)0x106440;
    pcVar10 = (char *)std::__cxx11::string::c_str();
    pcStack_2bc0 = (char *)0x10644d;
    pid = open(pcVar10,0);
    bVar3 = false;
    pcStack_2bc0 = (char *)0x106479;
    local_2844 = pid;
    local_2845 = anon_unknown.dwarf_5c0f::is_squashfuse_mounted((string *)local_1120,true);
    if (!(bool)local_2845) {
      if (pid != -1) {
        pcStack_2bc0 = (char *)0x1064a5;
        close(pid);
        pid = -1;
      }
      pcStack_2bc0 = (char *)0x106503;
      anon_unknown.dwarf_5c0f::check_file_sanity((string *)local_1120,Directory,0x1ed);
      pcStack_2bc0 = (char *)0x10650a;
      __pid = fork();
      if (__pid < 0) {
        local_2850 = (LogFatal *)((long)&opts.field_2 + 8);
        pcStack_2bc0 = (char *)0x106537;
        memset(local_2850,0,0x188);
        pcStack_2bc0 = (char *)0x106543;
        tools::xar::detail::LogFatal::LogFatal(local_2850);
        pcStack_2bc0 = (char *)0x106551;
        local_2858 = tools::xar::detail::LogFatal::stream((LogFatal *)((long)&opts.field_2 + 8));
        pcStack_2bc0 = (char *)0x10656d;
        local_2860 = std::operator<<(local_2858,"FATAL ");
        pcStack_2bc0 = (char *)0x106589;
        local_2868 = std::operator<<(local_2860,
                                     "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                    );
        pcStack_2bc0 = (char *)0x1065a5;
        local_2870 = std::operator<<(local_2868,":");
        pcStack_2bc0 = (char *)0x1065bf;
        local_2878 = (ostream *)std::ostream::operator<<(local_2870,0x1ba);
        pcStack_2bc0 = (char *)0x1065db;
        local_2880 = std::operator<<(local_2878,": ");
        pcStack_2bc0 = (char *)0x1065f7;
        local_2888 = std::operator<<(local_2880,"pid >= 0");
        pcStack_2bc0 = (char *)0x106613;
        local_2890 = std::operator<<(local_2888,": ");
        pcStack_2bc0 = (char *)0x106621;
        piVar13 = __errno_location();
        pcStack_2bc0 = (char *)0x106628;
        pcVar10 = strerror(*piVar13);
        pcStack_2bc0 = (char *)0x106637;
        std::operator<<(local_2890,pcVar10);
        pcStack_2bc0 = &LAB_00106645;
        tools::xar::detail::LogFatal::~LogFatal((LogFatal *)((long)&opts.field_2 + 8));
      }
      if (__pid == 0) {
        pcStack_2bc0 = (char *)0x1066a7;
        anon_unknown.dwarf_5c0f::sanitize_file_descriptors();
        pcStack_2bc0 = (char *)0x1066bc;
        std::__cxx11::to_string(&local_1528,end);
        pcStack_2bc0 = (char *)0x1066d8;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1508,"-ooffset=",&local_1528);
        pcStack_2bc0 = (char *)0x1066e6;
        std::__cxx11::string::~string((string *)&local_1528);
        if (mount_path.field_2._8_8_ != 0) {
          pcStack_2bc0 = (char *)0x106707;
          std::__cxx11::to_string(&local_1568,mount_path.field_2._8_8_);
          pcStack_2bc0 = (char *)0x106723;
          std::operator+(&local_1548,",timeout=",&local_1568);
          pcStack_2bc0 = (char *)0x106738;
          std::__cxx11::string::operator+=((string *)local_1508,(string *)&local_1548);
          pcStack_2bc0 = (char *)0x106746;
          std::__cxx11::string::~string((string *)&local_1548);
          pcStack_2bc0 = (char *)0x106752;
          std::__cxx11::string::~string((string *)&local_1568);
        }
        local_2898 = &local_1589;
        pcStack_2bc0 = (char *)0x1067e4;
        std::allocator<char>::allocator();
        pcStack_2bc0 = (char *)0x1067fe;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ret,"/etc/fuse.conf",local_2898);
        pcStack_2bc0 = (char *)0x10680c;
        local_2899 = tools::xar::fuse_allows_visible_mounts((string *)&ret);
        pcStack_2bc0 = (char *)0x106820;
        std::__cxx11::string::~string((string *)&ret);
        pcStack_2bc0 = (char *)0x10682c;
        std::allocator<char>::~allocator(&local_1589);
        if ((local_2899 & 1) != 0) {
          pcStack_2bc0 = (char *)0x10684b;
          std::__cxx11::string::operator+=((string *)local_1508,",allow_root");
        }
        local_28c0 = (anonymous_namespace)::kSquashFuseExecutable;
        local_28b8 = (anonymous_namespace)::kSquashFuseExecutable;
        pcStack_2bc0 = (char *)0x1068ba;
        local_28b0 = std::__cxx11::string::c_str();
        local_28a8 = header._M_h._M_single_bucket;
        pcStack_2bc0 = (char *)0x1068db;
        uVar15 = std::__cxx11::string::c_str();
        pcStack_2bc0 = (char *)0x106906;
        local_1590 = execlp(local_28c0,local_28b8,local_28b0,local_28a8,uVar15,0);
        if (local_1590 != 0) {
          local_28c8 = (LogFatal *)local_1718;
          pcStack_2bc0 = (char *)0x106933;
          memset(local_28c8,0,0x188);
          pcStack_2bc0 = (char *)0x10693f;
          tools::xar::detail::LogFatal::LogFatal(local_28c8);
          pcStack_2bc0 = (char *)0x10694d;
          local_28d0 = tools::xar::detail::LogFatal::stream((LogFatal *)local_1718);
          pcStack_2bc0 = (char *)0x106969;
          local_28d8 = std::operator<<(local_28d0,"FATAL ");
          pcStack_2bc0 = (char *)0x106985;
          local_28e0 = std::operator<<(local_28d8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                      );
          pcStack_2bc0 = (char *)0x1069a1;
          local_28e8 = std::operator<<(local_28e0,":");
          pcStack_2bc0 = (char *)0x1069bb;
          local_28f0 = (ostream *)std::ostream::operator<<(local_28e8,0x1cc);
          pcStack_2bc0 = (char *)0x1069d7;
          local_28f8 = std::operator<<(local_28f0,": ");
          pcStack_2bc0 = (char *)0x1069f3;
          local_2900 = std::operator<<(local_28f8,"Failed to exec squashfuse_ll: ");
          pcStack_2bc0 = (char *)0x106a01;
          piVar13 = __errno_location();
          pcStack_2bc0 = (char *)0x106a08;
          pcVar10 = strerror(*piVar13);
          pcStack_2bc0 = (char *)0x106a17;
          local_2908 = std::operator<<(local_2900,pcVar10);
          pcStack_2bc0 = (char *)0x106a33;
          std::operator<<(local_2908,
                          ". Try installing squashfuse from https://github.com/vasi/squashfuse/releases."
                         );
          pcStack_2bc0 = &LAB_00106a41;
          tools::xar::detail::LogFatal::~LogFatal((LogFatal *)local_1718);
        }
        pcStack_2bc0 = (char *)0x106a6b;
        std::__cxx11::string::~string((string *)local_1508);
      }
      else {
        local_171c = 0;
        pcStack_2bc0 = (char *)0x106a9f;
        local_290c = waitpid(__pid,(int *)&local_171c,0);
        if (local_290c != __pid) {
          local_2918 = &local_18a8;
          pcStack_2bc0 = (char *)0x106ad3;
          memset(local_2918,0,0x188);
          pcStack_2bc0 = (char *)0x106adf;
          tools::xar::detail::LogFatal::LogFatal(local_2918);
          pcStack_2bc0 = (char *)0x106aed;
          local_2920 = tools::xar::detail::LogFatal::stream(&local_18a8);
          pcStack_2bc0 = (char *)0x106b09;
          local_2928 = std::operator<<(local_2920,"FATAL ");
          pcStack_2bc0 = (char *)0x106b25;
          local_2930 = std::operator<<(local_2928,
                                       "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                      );
          pcStack_2bc0 = (char *)0x106b41;
          local_2938 = std::operator<<(local_2930,":");
          pcStack_2bc0 = (char *)0x106b5b;
          local_2940 = (ostream *)std::ostream::operator<<(local_2938,0x1d2);
          pcStack_2bc0 = (char *)0x106b77;
          local_2948 = std::operator<<(local_2940,": ");
          pcStack_2bc0 = (char *)0x106b93;
          local_2950 = std::operator<<(local_2948,"waitpid(pid, &status, 0) == pid");
          pcStack_2bc0 = (char *)0x106baf;
          local_2958 = std::operator<<(local_2950,": ");
          pcStack_2bc0 = (char *)0x106bbd;
          piVar13 = __errno_location();
          pcStack_2bc0 = (char *)0x106bc4;
          pcVar10 = strerror(*piVar13);
          pcStack_2bc0 = (char *)0x106bd3;
          std::operator<<(local_2958,pcVar10);
          pcStack_2bc0 = &LAB_00106be1;
          tools::xar::detail::LogFatal::~LogFatal(&local_18a8);
        }
        if ((local_171c & 0x7f) != 0) {
          if ('\0' < (char)(((byte)local_171c & 0x7f) + 1) >> 1) {
            local_29a0 = &local_1bb8;
            pcStack_2bc0 = (char *)0x106db5;
            memset(local_29a0,0,0x188);
            pcStack_2bc0 = (char *)0x106dc1;
            tools::xar::detail::LogFatal::LogFatal(local_29a0);
            pcStack_2bc0 = (char *)0x106dcf;
            local_29a8 = tools::xar::detail::LogFatal::stream(&local_1bb8);
            pcStack_2bc0 = (char *)0x106deb;
            local_29b0 = std::operator<<(local_29a8,"FATAL ");
            pcStack_2bc0 = (char *)0x106e07;
            local_29b8 = std::operator<<(local_29b0,
                                         "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                        );
            pcStack_2bc0 = (char *)0x106e23;
            local_29c0 = std::operator<<(local_29b8,":");
            pcStack_2bc0 = (char *)0x106e3d;
            local_29c8 = (ostream *)std::ostream::operator<<(local_29c0,0x1da);
            pcStack_2bc0 = (char *)0x106e59;
            local_29d0 = std::operator<<(local_29c8,": ");
            pcStack_2bc0 = (char *)0x106e75;
            local_29d8 = std::operator<<(local_29d0,"squashfuse_ll failed with signal ");
            pcStack_2bc0 = (char *)0x106e93;
            std::ostream::operator<<(local_29d8,local_171c & 0x7f);
            pcStack_2bc0 = &LAB_00106ea1;
            tools::xar::detail::LogFatal::~LogFatal(&local_1bb8);
          }
          local_29e0 = (LogFatal *)&start;
          pcStack_2bc0 = (char *)0x106ed9;
          memset(local_29e0,0,0x188);
          pcStack_2bc0 = (char *)0x106ee5;
          tools::xar::detail::LogFatal::LogFatal(local_29e0);
          pcStack_2bc0 = (char *)0x106ef3;
          local_29e8 = tools::xar::detail::LogFatal::stream((LogFatal *)&start);
          pcStack_2bc0 = (char *)0x106f0f;
          local_29f0 = std::operator<<(local_29e8,"FATAL ");
          pcStack_2bc0 = (char *)0x106f2b;
          local_29f8 = std::operator<<(local_29f0,
                                       "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                      );
          pcStack_2bc0 = (char *)0x106f47;
          local_2a00 = std::operator<<(local_29f8,":");
          pcStack_2bc0 = (char *)0x106f61;
          local_2a08 = (ostream *)std::ostream::operator<<(local_2a00,0x1dc);
          pcStack_2bc0 = (char *)0x106f7d;
          local_2a10 = std::operator<<(local_2a08,": ");
          pcStack_2bc0 = (char *)0x106f99;
          local_2a18 = std::operator<<(local_2a10,"squashfuse_ll failed with unknown exit status ");
          pcStack_2bc0 = (char *)0x106fb4;
          std::ostream::operator<<(local_2a18,local_171c);
          pcStack_2bc0 = &LAB_00106fc2;
          tools::xar::detail::LogFatal::~LogFatal((LogFatal *)&start);
        }
        if ((int)(local_171c & 0xff00) >> 8 != 0) {
          local_2960 = &local_1a30;
          pcStack_2bc0 = (char *)0x106c74;
          memset(local_2960,0,0x188);
          pcStack_2bc0 = (char *)0x106c80;
          tools::xar::detail::LogFatal::LogFatal(local_2960);
          pcStack_2bc0 = (char *)0x106c8e;
          local_2968 = tools::xar::detail::LogFatal::stream(&local_1a30);
          pcStack_2bc0 = (char *)0x106caa;
          local_2970 = std::operator<<(local_2968,"FATAL ");
          pcStack_2bc0 = (char *)0x106cc6;
          local_2978 = std::operator<<(local_2970,
                                       "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                      );
          pcStack_2bc0 = (char *)0x106ce2;
          local_2980 = std::operator<<(local_2978,":");
          pcStack_2bc0 = (char *)0x106cfc;
          local_2988 = (ostream *)std::ostream::operator<<(local_2980,0x1d6);
          pcStack_2bc0 = (char *)0x106d18;
          local_2990 = std::operator<<(local_2988,": ");
          pcStack_2bc0 = (char *)0x106d34;
          local_2998 = std::operator<<(local_2990,"squashfuse_ll failed with exit status ");
          pcStack_2bc0 = (char *)0x106d50;
          std::ostream::operator<<(local_2998,local_171c >> 8 & 0xff);
          pcStack_2bc0 = &LAB_00106d5e;
          tools::xar::detail::LogFatal::~LogFatal(&local_1a30);
        }
      }
      bVar3 = true;
    }
    pcStack_2bc0 = (char *)0x106fee;
    timeout.__r = std::chrono::_V2::steady_clock::now();
    local_1d50.__r = 9;
    while( true ) {
      pcStack_2bc0 = (char *)0x107011;
      local_2a19 = anon_unknown.dwarf_5c0f::is_squashfuse_mounted((string *)local_1120,false);
      if (((local_2a19 ^ 0xff) & 1) == 0) break;
      pcStack_2bc0 = (char *)0x10702f;
      local_1d60.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      pcStack_2bc0 = (char *)0x107049;
      local_2a28 = (rep)std::chrono::operator-
                                  (&local_1d60,
                                   (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&timeout);
      pcStack_2bc0 = (char *)0x107073;
      local_1d58.__r = local_2a28;
      local_2a29 = std::chrono::operator>(&local_1d58,&local_1d50);
      if ((bool)local_2a29) {
        local_2a38 = &local_1ee8;
        pcStack_2bc0 = (char *)0x1070a4;
        memset(local_2a38,0,0x188);
        pcStack_2bc0 = (char *)0x1070b0;
        tools::xar::detail::LogFatal::LogFatal(local_2a38);
        pcStack_2bc0 = (char *)0x1070be;
        local_2a40 = tools::xar::detail::LogFatal::stream(&local_1ee8);
        pcStack_2bc0 = (char *)0x1070da;
        local_2a48 = std::operator<<(local_2a40,"FATAL ");
        pcStack_2bc0 = (char *)0x1070f6;
        local_2a50 = std::operator<<(local_2a48,
                                     "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                    );
        pcStack_2bc0 = (char *)0x107112;
        local_2a58 = std::operator<<(local_2a50,":");
        pcStack_2bc0 = (char *)0x10712c;
        local_2a60 = (ostream *)std::ostream::operator<<(local_2a58,0x1e7);
        pcStack_2bc0 = (char *)0x107148;
        local_2a68 = std::operator<<(local_2a60,": ");
        pcStack_2bc0 = (char *)0x107164;
        std::operator<<(local_2a68,"timed out waiting for squashfs mount");
        pcStack_2bc0 = &LAB_00107172;
        tools::xar::detail::LogFatal::~LogFatal(&local_1ee8);
      }
      local_1ef4 = 100;
      pcStack_2bc0 = (char *)0x1071ad;
      std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000000l>> *)&local_1ef0,&local_1ef4);
      pcStack_2bc0 = (char *)0x1071bb;
      std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(&local_1ef0);
    }
    pcStack_2bc0 = (char *)0x1071d3;
    iVar8 = futimes(iVar8,(timeval *)0x0);
    if (iVar8 != 0) {
      local_2a70 = &local_2080;
      pcStack_2bc0 = (char *)0x1071f6;
      memset(local_2a70,0,0x188);
      pcStack_2bc0 = (char *)0x107202;
      tools::xar::detail::LogFatal::LogFatal(local_2a70);
      pcStack_2bc0 = (char *)0x107210;
      local_2a78 = tools::xar::detail::LogFatal::stream(&local_2080);
      pcStack_2bc0 = (char *)0x10722c;
      local_2a80 = std::operator<<(local_2a78,"FATAL ");
      pcStack_2bc0 = (char *)0x107248;
      local_2a88 = std::operator<<(local_2a80,
                                   "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                  );
      pcStack_2bc0 = (char *)0x107264;
      local_2a90 = std::operator<<(local_2a88,":");
      pcStack_2bc0 = (char *)0x10727e;
      local_2a98 = (ostream *)std::ostream::operator<<(local_2a90,0x1ef);
      pcStack_2bc0 = (char *)0x10729a;
      local_2aa0 = std::operator<<(local_2a98,": ");
      pcStack_2bc0 = (char *)0x1072b6;
      local_2aa8 = std::operator<<(local_2aa0,"futimes(lock_fd, nullptr) == 0");
      pcStack_2bc0 = (char *)0x1072d2;
      local_2ab0 = std::operator<<(local_2aa8,": ");
      pcStack_2bc0 = (char *)0x1072e0;
      piVar13 = __errno_location();
      pcStack_2bc0 = (char *)0x1072e7;
      pcVar10 = strerror(*piVar13);
      pcStack_2bc0 = (char *)0x1072f6;
      std::operator<<(local_2ab0,pcVar10);
      pcStack_2bc0 = &LAB_00107304;
      tools::xar::detail::LogFatal::~LogFatal(&local_2080);
    }
    if (bVar2) {
      pcStack_2bc0 = (char *)0x107370;
      local_2ab8 = std::operator<<((ostream *)&std::cout,(string *)local_1120);
      pcStack_2bc0 = (char *)0x10738c;
      std::ostream::operator<<(local_2ab8,std::endl<char,std::char_traits<char>>);
      puVar17 = (undefined1 *)&pcStack_2bb8;
    }
    else {
      if (pid == -1) {
        pcStack_2bc0 = (char *)0x1073b9;
        pcVar10 = (char *)std::__cxx11::string::c_str();
        pcStack_2bc0 = (char *)0x1073c6;
        local_2abc = open(pcVar10,0);
        pid = local_2abc;
      }
      if (pid == -1) {
        local_2ac8 = &local_2208;
        pcStack_2bc0 = (char *)0x107401;
        memset(local_2ac8,0,0x188);
        pcStack_2bc0 = (char *)0x10740d;
        tools::xar::detail::LogFatal::LogFatal(local_2ac8);
        pcStack_2bc0 = (char *)0x10741b;
        local_2ad0 = tools::xar::detail::LogFatal::stream(&local_2208);
        pcStack_2bc0 = (char *)0x107437;
        local_2ad8 = std::operator<<(local_2ad0,"FATAL ");
        pcStack_2bc0 = (char *)0x107453;
        local_2ae0 = std::operator<<(local_2ad8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                    );
        pcStack_2bc0 = (char *)0x10746f;
        local_2ae8 = std::operator<<(local_2ae0,":");
        pcStack_2bc0 = (char *)0x107489;
        local_2af0 = (ostream *)std::ostream::operator<<(local_2ae8,0x1fc);
        pcStack_2bc0 = (char *)0x1074a5;
        local_2af8 = std::operator<<(local_2af0,": ");
        pcStack_2bc0 = (char *)0x1074c1;
        local_2b00 = std::operator<<(local_2af8,"Unable to open ");
        pcStack_2bc0 = (char *)0x1074dd;
        local_2b08 = std::operator<<(local_2b00,(string *)local_1330);
        pcStack_2bc0 = (char *)0x1074f9;
        local_2b10 = std::operator<<(local_2b08,": ");
        pcStack_2bc0 = (char *)0x107507;
        piVar13 = __errno_location();
        pcStack_2bc0 = (char *)0x10750e;
        pcVar10 = strerror(*piVar13);
        pcStack_2bc0 = (char *)0x10751d;
        std::operator<<(local_2b10,pcVar10);
        pcStack_2bc0 = &LAB_0010752b;
        tools::xar::detail::LogFatal::~LogFatal(&local_2208);
      }
      local_2218 = (ulong)((int)argv_local + 4);
      lVar1 = -(local_2218 * 8 + 0xf & 0xfffffffffffffff0);
      local_2b18 = (char **)((long)&pcStack_2bb8 + lVar1);
      __vla_expr0 = (unsigned_long)&pcStack_2bb8;
      *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x107588;
      pcVar10 = strdup("/bin/sh");
      *local_2b18 = pcVar10;
      *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x1075a1;
      pcVar10 = strdup("-e");
      local_2b18[1] = pcVar10;
      *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x1075bb;
      pcVar10 = (char *)std::__cxx11::string::c_str();
      *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x1075c3;
      pcVar10 = strdup(pcVar10);
      ppcVar5 = local_2b18;
      local_2b18[2] = pcVar10;
      if (((*ppcVar5 == (char *)0x0) || (local_2b18[1] == (char *)0x0)) ||
         (local_2b18[2] == (char *)0x0)) {
        local_2b20 = (LogFatal *)&i_1;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x107611;
        memset((LogFatal *)&i_1,0,0x188);
        pLVar4 = local_2b20;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x10761d;
        tools::xar::detail::LogFatal::LogFatal(pLVar4);
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x10762b;
        poVar16 = tools::xar::detail::LogFatal::stream((LogFatal *)&i_1);
        local_2b28 = poVar16;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x107647;
        poVar16 = std::operator<<(poVar16,"FATAL ");
        local_2b30 = poVar16;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x107663;
        poVar16 = std::operator<<(poVar16,
                                  "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                 );
        local_2b38 = poVar16;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x10767f;
        poVar16 = std::operator<<(poVar16,":");
        local_2b40 = poVar16;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x107699;
        poVar16 = (ostream *)std::ostream::operator<<(poVar16,0x20c);
        local_2b48 = poVar16;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x1076b5;
        poVar16 = std::operator<<(poVar16,": ");
        local_2b50 = poVar16;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x1076d1;
        poVar16 = std::operator<<(poVar16,"strdup failed, call the cops");
        local_2b58 = poVar16;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x1076ed;
        local_2b60 = std::operator<<(poVar16,": ");
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x1076fb;
        piVar13 = __errno_location();
        iVar8 = *piVar13;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x107702;
        pcVar10 = strerror(iVar8);
        poVar16 = local_2b60;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x107711;
        std::operator<<(poVar16,pcVar10);
        *(undefined1 **)((long)&pcStack_2bc0 + lVar1) = &LAB_0010771f;
        tools::xar::detail::LogFatal::~LogFatal((LogFatal *)&i_1);
      }
      local_2b18[3] = (char *)header._M_h._M_single_bucket;
      for (local_23a4 = 0; local_23a4 < (int)argv_local + -1; local_23a4 = local_23a4 + 1) {
        local_2b18[local_23a4 + 4] = *(char **)(tv.tv_usec + (long)local_23a4 * 8);
      }
      local_2b18[(int)argv_local + 3] = (char *)0x0;
      for (local_23a8 = 0; local_2b18[local_23a8] != (char *)0x0; local_23a8 = local_23a8 + 1) {
      }
      if (bVar3) {
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x107806;
        setenv("XARFUSE_NEW_MOUNT","1",1);
      }
      *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x107811;
      umask(__mask);
      ppcVar5 = local_2b18;
      pcVar10 = *local_2b18;
      *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x107820;
      iVar8 = execv(pcVar10,ppcVar5);
      puVar17 = (undefined1 *)__vla_expr0;
      if (iVar8 != 0) {
        local_2b68 = &local_2530;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x107843;
        memset(&local_2530,0,0x188);
        pLVar4 = local_2b68;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x10784f;
        tools::xar::detail::LogFatal::LogFatal(pLVar4);
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x10785d;
        poVar16 = tools::xar::detail::LogFatal::stream(&local_2530);
        local_2b70 = poVar16;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x107879;
        poVar16 = std::operator<<(poVar16,"FATAL ");
        local_2b78 = poVar16;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x107895;
        poVar16 = std::operator<<(poVar16,
                                  "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                 );
        local_2b80 = poVar16;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x1078b1;
        poVar16 = std::operator<<(poVar16,":");
        local_2b88 = poVar16;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x1078cb;
        poVar16 = (ostream *)std::ostream::operator<<(poVar16,0x21f);
        local_2b90 = poVar16;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x1078e7;
        poVar16 = std::operator<<(poVar16,": ");
        local_2b98 = poVar16;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x107903;
        local_2ba0 = std::operator<<(poVar16,"execv: ");
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x107911;
        piVar13 = __errno_location();
        iVar8 = *piVar13;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x107918;
        pcVar10 = strerror(iVar8);
        poVar16 = local_2ba0;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x107927;
        poVar16 = std::operator<<(poVar16,pcVar10);
        local_2ba8 = poVar16;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x107943;
        poVar16 = std::operator<<(poVar16,"cmd: ");
        pcVar10 = *local_2b18;
        local_2bb0 = poVar16;
        *(undefined8 *)((long)&pcStack_2bc0 + lVar1) = 0x107962;
        std::operator<<(poVar16,pcVar10);
        *(undefined1 **)((long)&pcStack_2bc0 + lVar1) = &LAB_00107970;
        tools::xar::detail::LogFatal::~LogFatal(&local_2530);
      }
    }
    *(undefined8 *)(puVar17 + 0xfffffffffffffff8) = 0x1079b5;
    std::__cxx11::string::~string((string *)local_1330);
    *(undefined8 *)(puVar17 + 0xfffffffffffffff8) = 0x1079c1;
    std::__cxx11::string::~string((string *)local_1160);
  }
  *(undefined8 *)(puVar17 + 0xfffffffffffffff8) = 0x1079e9;
  std::__cxx11::string::~string((string *)local_1120);
  *(undefined8 *)(puVar17 + 0xfffffffffffffff8) = 0x1079f5;
  std::__cxx11::string::~string((string *)local_1028);
  *(undefined8 *)(puVar17 + 0xfffffffffffffff8) = 0x107a01;
  std::__cxx11::string::~string((string *)&env_seed);
  *(undefined8 *)(puVar17 + 0xfffffffffffffff8) = 0x107a0d;
  std::__cxx11::string::~string((string *)local_9b0);
  *(undefined8 *)(puVar17 + 0xfffffffffffffff8) = 0x107a19;
  std::__cxx11::string::~string((string *)&it);
  *(undefined8 *)(puVar17 + 0xfffffffffffffff8) = 0x107a25;
  std::__cxx11::string::~string(local_468);
  *(undefined8 *)(puVar17 + 0xfffffffffffffff8) = 0x107a31;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&offset);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  struct timeval tv;
  gettimeofday(&tv, nullptr);
  double launch_time = (double)tv.tv_usec / 1000000.0 + tv.tv_sec;
  setenv("XAREXEC_LAUNCH_TIMESTAMP", std::to_string(launch_time).c_str(), true);
  XAR_CHECK_SIMPLE(getuid() == geteuid());
  // Set our umask to a good default for the files we create.  Save
  // the old value to restore before executing the XAR bootstrap
  // script.
  auto old_umask = umask(0022);

  if (argc < 2) {
    usage();
    return 1;
  }

  // Skip past our executable name, the optional -m flag, and, after
  // stashing a copy of it, the path to the xar file.  This leaves
  // argv[0:argc-1] as the parameters to pass to the process we exec.
  argv++;
  argc--;
  bool mount_only = false;
  bool print_only = false;
  while (argv[0] && argv[0][0] == '-') {
    if (strcmp(argv[0], "-m") == 0) {
      mount_only = true;
    } else if (strcmp(argv[0], "-n") == 0) {
      print_only = true;
    } else if (strcmp(argv[0], "-h") == 0) {
      usage();
      return 0;
    } else {
      usage();
      return 1;
    }
    argv++;
    argc--;
  }
  if (!argv[0]) {
    usage();
    return 1;
  }
  char* xar_path = argv[0];
  argv++;
  argc--;

  // Extract our required fields from the XAR header.  XAREXEC_TARGET
  // is required unless the -m flag was used.
  auto header = tools::xar::read_xar_header(xar_path);
  size_t offset;
  try {
    size_t end;
    offset = std::stoull(header[tools::xar::kOffsetName], &end);
    if (end != header[tools::xar::kOffsetName].size()) {
      throw std::invalid_argument("Offset not entirely an integer");
    }
  } catch (const std::exception& ex) {
    cerr << "Header offset is non-integral: " << header[tools::xar::kOffsetName]
         << endl;
    XAR_FATAL << "Exact error: " << ex.what();
  }
  std::string uuid = header[tools::xar::kUuidName];
  std::string execpath;
  auto it = header.find(tools::xar::kXarexecTarget);
  if (it != header.end()) {
    execpath = it->second;
  }
  if (!mount_only && execpath.empty()) {
    XAR_FATAL << "No XAREXEC_TARGET in XAR header of " << xar_path;
  }
  if (!std::all_of(uuid.begin(), uuid.end(), isxdigit)) {
    XAR_FATAL << "uuid must only contain hex digits";
  }
  if (uuid.empty()) {
    XAR_FATAL << "uuid must be non-empty";
  }

  // If provided, use a non-default mount root from the header.
  std::string mountroot;
  it = header.find(tools::xar::kMountRoot);
  if (it != header.end()) {
    mountroot = it->second;
  } else {
    // Otherwise find the first proper mount root from our list of
    // defaults.
    for (const auto& candidate : tools::xar::default_mount_roots()) {
      struct stat st;
      if (stat(candidate.c_str(), &st) == 0 && (st.st_mode & 07777) == 01777) {
        mountroot = candidate;
        break;
      }
    }
    if (mountroot.empty()) {
      tools::xar::no_mount_roots_help_message(XAR_FATAL);
    }
  }

  struct stat st;
  if (stat(mountroot.c_str(), &st) != 0) {
    XAR_FATAL << "Failed to stat mount root '" << mountroot
              << "': " << strerror(errno);
  }
  if ((st.st_mode & 07777) != 01777) {
    XAR_FATAL << "Mount root '" << mountroot << "' permissions should be 01777";
  }

  // Path is /mnt/xarfuse/uid-N/UUID-ns-Y; we make directories under
  // /mnt/xarfuse as needed. Replace /mnt/xarfuse with custom values
  // as specified.
  std::string user_basedir = get_user_basedir(mountroot);

  // mtab sucks.  In some environments, particularly centos6, when
  // mtab is shared between different mount namespaces, we want to
  // disambiguate by more than just the XAR's uuid and user's uid.  We
  // use the mount namespace id, but optionally also take a
  // user-specified "seed" from the environment.  We cannot rely
  // purely on mount namespace as the kernel will aggressively re-use
  // namespace IDs, so while namespace helps with concurrent jobs, it
  // can fail with jobs run after other jobs.
  auto env_seed = getenv("XAR_MOUNT_SEED");
  std::string mount_directory = uuid;
  if (env_seed && *env_seed && strchr(env_seed, '/') == nullptr) {
    mount_directory += "-seed-";
    mount_directory += env_seed;
  } else if (stat("/proc/self/ns/pid", &st) == 0) {
    mount_directory += "-seed-nspid" + std::to_string(st.st_ino);

    // Sometimes we are in the same namespace but different cgroups
    // (e.g. systemd using cgroups to control process lifetime but not
    // putting processes into mount namespaces).  This can cause
    // cgroup termination to destroy a shared squashfuse_ll process.
    //
    // Use the inode of the cgroup we are running in.  Note this is
    // best effort in kernel 5.2 as inode numbers can be reused
    // sequentially (but not concurrently); kernel 5.6 makes this
    // truly unique across boots.
    auto maybe_cgroup_inode =
        tools::xar::read_sysfs_cgroup_inode("/proc/self/cgroup");
    if (maybe_cgroup_inode) {
      mount_directory += "_cgpid" + std::to_string(*maybe_cgroup_inode);
    }
  }

  // Try to determine our mount namespace id (via the inode on
  // /proc/self/ns/mnt); if we can, make that part of our mountpoint's
  // name.  This ensures that /etc/mtab on centos6 has unique entries
  // for processes in different namespaces, even if /etc itself is
  // shared among them.  See t12007704 for details.
  // Note: will fail on macOS.
  if (stat("/proc/self/ns/mnt", &st) == 0) {
    mount_directory += "-ns-" + std::to_string(st.st_ino);
  }

  const size_t squashfuse_idle_timeout = get_squashfuse_timeout();

  auto mount_path = user_basedir + "/" + mount_directory;
  if (print_only) {
    cout << mount_path << endl;
    return 0;
  }

  // Our lockfile for directory /mnt/xarfuse/uid-N/UUID-ns-Y is
  // /mnt/xarfuse/uid-N/lockfile.UUID-ns-Y.
  auto lockfile = user_basedir + "/lockfile." + mount_directory;
  int lock_fd = grab_lock(lockfile);
  if (mkdir(mount_path.c_str(), 0755) == 0) {
    // On macOS, mkdir sets the new directory's group to the enclosing directory
    // which is not necessarily owned by the euid executing the xar. Instead,
    // chown() the new directory to the euid and egid.
    if (kIsDarwin) {
      XAR_PCHECK_SIMPLE(chown(mount_path.c_str(), geteuid(), getegid()) == 0);
    }
  } else if (errno != EEXIST) {
    XAR_FATAL << "mkdir failed:" << strerror(errno);
  }

  // Construct our exec path; if it already exists, we're done and can
  // simply execute it.
  const std::string exec_path = mount_path + "/" + execpath;
  if (tools::xar::debugging) {
    cerr << "exec: " << exec_path << " as " << getuid() << " " << getgid()
         << endl;
  }

  // Hold a file descriptor open to one of the files in the XAR; this
  // will prevent unmounting as we exec the bootstrap and it execs
  // anything.  Intentionally not O_CLOEXEC.  This is necessary
  // because the exec call typically targets a shell script inside the
  // XAR and so the script won't remain open while the exec happens --
  // the kernel will examine it, run a bash process, and that will
  // open the shell script.  Between the parsing and bash opening it,
  // the mount point could disappear.  Also, that script itself often
  // exec's the python interpreter living on local disk, which will
  // open a py file in the XAR... again a brief moment where the
  // unmount can occur.  We open now, very early to signal to
  // squashfuse_ll before the statfs call, but will try to re-open
  // later if this one fails.  So ignore the return code for now.
  int bootstrap_fd = open(exec_path.c_str(), O_RDONLY);

  bool newMount = false;
  // TODO(chip): also mount DEPENDENCIES
  if (!is_squashfuse_mounted(mount_path, true)) {
    // This should never happen.  And yet, just in case, let's make
    // sure we will hold the right file open.
    if (bootstrap_fd != -1) {
      // TODO: one day we should find a way to log or bump a key; this
      // would be a good case.
      close(bootstrap_fd);
      bootstrap_fd = -1;
    }
    // Check mount_path sanity before mounting; once mounted, though,
    // the permissions may change, so we have to do the check after we
    // grab the lock but know we need to perform a mount.
    check_file_sanity(mount_path, Expectation::Directory, 0755);

    pid_t pid = fork();
    XAR_PCHECK_SIMPLE(pid >= 0);
    if (pid == 0) {
      sanitize_file_descriptors();
      std::string opts = "-ooffset=" + std::to_string(offset);
      if (squashfuse_idle_timeout > 0) {
        opts += ",timeout=" + std::to_string(squashfuse_idle_timeout);
      }
      if (tools::xar::fuse_allows_visible_mounts("/etc/fuse.conf")) {
        opts += ",allow_root";
      }
      auto const ret = execlp(
          kSquashFuseExecutable,
          kSquashFuseExecutable,
          opts.c_str(),
          xar_path,
          mount_path.c_str(),
          nullptr);
      if (ret != 0) {
        XAR_FATAL << "Failed to exec squashfuse_ll: " << strerror(errno)
                  << ". Try installing squashfuse from "
                     "https://github.com/vasi/squashfuse/releases.";
      }
    } else {
      int status = 0;
      XAR_PCHECK_SIMPLE(waitpid(pid, &status, 0) == pid);
      // We only make it out of this block if we have an exit status of 0.
      if (WIFEXITED(status)) {
        if (WEXITSTATUS(status) != 0) {
          XAR_FATAL << "squashfuse_ll failed with exit status "
                    << WEXITSTATUS(status);
        }
      } else if (WIFSIGNALED(status)) {
        XAR_FATAL << "squashfuse_ll failed with signal " << WTERMSIG(status);
      } else {
        XAR_FATAL << "squashfuse_ll failed with unknown exit status " << status;
      }
    }
    newMount = true;
  }

  // Wait for up to 9 seconds for mount to be available
  auto start = std::chrono::steady_clock::now();
  auto timeout = std::chrono::seconds(9);
  while (!is_squashfuse_mounted(mount_path, false)) {
    if (std::chrono::steady_clock::now() - start > timeout) {
      XAR_FATAL << "timed out waiting for squashfs mount";
    }
    /* sleep override */
    std::this_thread::sleep_for(std::chrono::microseconds(100));
  }

  // Touch the lockfile; our unmount script will use it as a proxy for
  // unmounting "stale" mounts.
  XAR_PCHECK_SIMPLE(futimes(lock_fd, nullptr) == 0);

  if (mount_only) {
    cout << mount_path << endl;
    return 0;
  }

  // Retry opening our fd if we failed before.
  if (bootstrap_fd == -1) {
    bootstrap_fd = open(exec_path.c_str(), O_RDONLY);
  }
  // Still no success?  Bail.
  if (bootstrap_fd == -1) {
    XAR_FATAL << "Unable to open " << exec_path << ": " << strerror(errno);
  }

  // cmd line is:
  // newArgs[0] = "/bin/sh"
  // newArgs[1] = "-e"
  // newArgs[2] = mounted path inside squash file to run
  // newArgs[3] = path to the squash file itself
  // newArgs[4], newArgs[5], ... = args passed on our command line

  // Why argc + 5?  The 4 new params and the trailing nullptr entry.
  char* newArgs[argc + 5];
  newArgs[0] = strdup("/bin/sh");
  newArgs[1] = strdup("-e");
  newArgs[2] = strdup(exec_path.c_str());
  if (!newArgs[0] || !newArgs[1] || !newArgs[2]) {
    XAR_FATAL << "strdup failed, call the cops"
              << ": " << strerror(errno);
  }
  newArgs[3] = xar_path;
  for (int i = 0; i < argc; ++i) {
    newArgs[i + 4] = argv[i];
  }
  newArgs[argc + 4] = nullptr;
  for (int i = 0; newArgs[i]; ++i) {
    if (tools::xar::debugging) {
      cerr << "  exec arg: " << newArgs[i] << endl;
    }
  }

  if (newMount) {
    setenv("XARFUSE_NEW_MOUNT", "1", 1);
  }
  umask(old_umask);
  if (execv(newArgs[0], newArgs) != 0) {
    XAR_FATAL << "execv: " << strerror(errno) << "cmd: " << newArgs[0];
  }

  return 0;
}